

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcTendon::IfcTendon(IfcTendon *this)

{
  *(undefined ***)&this->field_0x220 = &PTR__Object_008048a0;
  *(undefined8 *)&this->field_0x228 = 0;
  *(char **)&this->field_0x230 = "IfcTendon";
  Schema_2x3::IfcReinforcingElement::IfcReinforcingElement
            (&this->super_IfcReinforcingElement,&PTR_construction_vtable_24__008a3cd8);
  *(undefined8 *)&(this->super_IfcReinforcingElement).field_0x198 = 0;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject = 0x8a3b58;
  *(undefined8 *)&this->field_0x220 = 0x8a3cc0;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x88 = 0x8a3b80;
  (this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
  super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x8a3ba8;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0xd0 = 0x8a3bd0;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.field_0x100 = 0x8a3bf8;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x138 = 0x8a3c20;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x148 = 0x8a3c48;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    field_0x158 = 0x8a3c70;
  *(undefined8 *)&(this->super_IfcReinforcingElement).field_0x190 = 0x8a3c98;
  *(undefined1 **)&(this->super_IfcReinforcingElement).field_0x1a0 = &this->field_0x1b0;
  *(undefined8 *)&this->field_0x1a8 = 0;
  this->field_0x1b0 = 0;
  (this->TensionForce).have = false;
  (this->PreStress).have = false;
  (this->FrictionCoefficient).have = false;
  (this->AnchorageSlip).have = false;
  (this->MinCurvatureRadius).have = false;
  return;
}

Assistant:

IfcTendon() : Object("IfcTendon") {}